

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_queryiv(NegativeTestContext *ctx)

{
  allocator<char> local_3d;
  GLint params;
  string local_38;
  
  params = -1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if target or pname is not an accepted value.",&local_3d);
  NegativeTestContext::beginSection(ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  glu::CallLogWrapper::glGetQueryiv(&ctx->super_CallLogWrapper,0x8c2f,0xffffffff,&params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glGetQueryiv(&ctx->super_CallLogWrapper,0xffffffff,0x8865,&params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glGetQueryiv(&ctx->super_CallLogWrapper,0xffffffff,0xffffffff,&params);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void get_queryiv (NegativeTestContext& ctx)
{
	GLint params = -1;

	ctx.beginSection("GL_INVALID_ENUM is generated if target or pname is not an accepted value.");
	ctx.glGetQueryiv	(GL_ANY_SAMPLES_PASSED, -1, &params);
	ctx.expectError		(GL_INVALID_ENUM);
	ctx.glGetQueryiv	(-1, GL_CURRENT_QUERY, &params);
	ctx.expectError		(GL_INVALID_ENUM);
	ctx.glGetQueryiv	(-1, -1, &params);
	ctx.expectError		(GL_INVALID_ENUM);
	ctx.endSection();
}